

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O3

void remove_region(int merge,REGIONS *regions,int *num_regions,int *next_region)

{
  REGIONS *pRVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined4 uVar6;
  uint uVar7;
  int iVar8;
  REGIONS *pRVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  
  if (*num_regions == 1) {
    *num_regions = 0;
    return;
  }
  iVar10 = *next_region;
  lVar12 = (long)iVar10;
  if (iVar10 == *num_regions + -1) {
    merge = 0;
  }
  iVar8 = 1;
  if (iVar10 != 0) {
    iVar8 = merge;
  }
  uVar7 = (iVar8 == 2) + 1;
  if (iVar8 == 2) {
    iVar11 = regions[lVar12 + 1].last;
  }
  else {
    if (iVar8 == 1) {
      regions[lVar12 + 1].start = regions[lVar12].start;
      iVar10 = (int)(lVar12 + 1);
      goto LAB_001f90f4;
    }
    iVar11 = regions[lVar12].last;
  }
  regions[lVar12 + -1].last = iVar11;
LAB_001f90f4:
  *next_region = iVar10;
  iVar10 = *num_regions;
  *num_regions = iVar10 - uVar7;
  iVar8 = *next_region - (uint)(iVar8 == 1);
  if (iVar8 < (int)(iVar10 - uVar7)) {
    lVar12 = (long)iVar8;
    pRVar9 = regions + lVar12;
    do {
      uVar6 = *(undefined4 *)&pRVar9[uVar7].field_0x34;
      pRVar9->type = pRVar9[uVar7].type;
      *(undefined4 *)&pRVar9->field_0x34 = uVar6;
      pRVar1 = pRVar9 + uVar7;
      iVar10 = pRVar1->start;
      iVar8 = pRVar1->last;
      dVar2 = pRVar1->avg_noise_var;
      dVar3 = pRVar9[uVar7].avg_cor_coeff;
      dVar4 = (&pRVar9[uVar7].avg_cor_coeff)[1];
      dVar5 = (&pRVar9[uVar7].avg_intra_err)[1];
      pRVar9->avg_intra_err = pRVar9[uVar7].avg_intra_err;
      pRVar9->avg_coded_err = dVar5;
      pRVar9->avg_cor_coeff = dVar3;
      pRVar9->avg_sr_fr_ratio = dVar4;
      pRVar9->start = iVar10;
      pRVar9->last = iVar8;
      pRVar9->avg_noise_var = dVar2;
      lVar12 = lVar12 + 1;
      pRVar9 = pRVar9 + 1;
    } while (lVar12 < *num_regions);
  }
  return;
}

Assistant:

static void remove_region(int merge, REGIONS *regions, int *num_regions,
                          int *next_region) {
  int k = *next_region;
  assert(k < *num_regions);
  if (*num_regions == 1) {
    *num_regions = 0;
    return;
  }
  if (k == 0) {
    merge = 1;
  } else if (k == *num_regions - 1) {
    merge = 0;
  }
  int num_merge = (merge == 2) ? 2 : 1;
  switch (merge) {
    case 0:
      regions[k - 1].last = regions[k].last;
      *next_region = k;
      break;
    case 1:
      regions[k + 1].start = regions[k].start;
      *next_region = k + 1;
      break;
    case 2:
      regions[k - 1].last = regions[k + 1].last;
      *next_region = k;
      break;
    default: assert(0);
  }
  *num_regions -= num_merge;
  for (k = *next_region - (merge == 1); k < *num_regions; k++) {
    regions[k] = regions[k + num_merge];
  }
}